

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

int Llb_NonlinQuantify1(Llb_Mgr_t *p,Llb_Prt_t *pPart,int fSubset)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  Llb_Prt_t *pLVar6;
  int local_60;
  int local_5c;
  int Length;
  int nSizeNew;
  int RetValue;
  int i;
  DdNode *bTemp;
  DdNode *bCube;
  Vec_Ptr_t *vSingles;
  Llb_Prt_t *pTemp;
  Llb_Var_t *pVar;
  Llb_Prt_t *pLStack_20;
  int fSubset_local;
  Llb_Prt_t *pPart_local;
  Llb_Mgr_t *p_local;
  
  pVar._4_4_ = fSubset;
  pLStack_20 = pPart;
  pPart_local = (Llb_Prt_t *)p;
  if (fSubset == 0) {
    bTemp = Llb_NonlinCreateCube1(p,pPart);
    Cudd_Ref(bTemp);
    _RetValue = pLStack_20->bFunc;
    pDVar5 = Cudd_bddExistAbstract(*(DdManager **)(pPart_local + 1),_RetValue,bTemp);
    pLStack_20->bFunc = pDVar5;
    Cudd_Ref(pLStack_20->bFunc);
    Cudd_RecursiveDeref(*(DdManager **)(pPart_local + 1),_RetValue);
    Cudd_RecursiveDeref(*(DdManager **)(pPart_local + 1),bTemp);
  }
  else {
    _RetValue = pPart->bFunc;
    pDVar5 = Cudd_LargestCube(p->dd,_RetValue,&local_60);
    pLStack_20->bFunc = pDVar5;
    Cudd_Ref(pLStack_20->bFunc);
    printf("Subsetting %3d : ",(ulong)(uint)pLStack_20->iPart);
    uVar1 = Cudd_SupportSize(*(DdManager **)(pPart_local + 1),_RetValue);
    uVar2 = Cudd_DagSize(_RetValue);
    printf("(Supp =%3d  Node =%5d) -> ",(ulong)uVar1,(ulong)uVar2);
    uVar1 = Cudd_SupportSize(*(DdManager **)(pPart_local + 1),pLStack_20->bFunc);
    uVar2 = Cudd_DagSize(pLStack_20->bFunc);
    printf("(Supp =%3d  Node =%5d)\n",(ulong)uVar1,(ulong)uVar2);
    iVar3 = Cudd_DagSize(_RetValue);
    iVar4 = Cudd_DagSize(pLStack_20->bFunc);
    Length = (int)(iVar3 == iVar4);
    Cudd_RecursiveDeref(*(DdManager **)(pPart_local + 1),_RetValue);
    if (Length != 0) {
      return 1;
    }
  }
  bCube = (DdNode *)Vec_PtrAlloc(0);
  local_5c = Cudd_DagSize(pLStack_20->bFunc);
  Extra_SupportArray(*(DdManager **)(pPart_local + 1),pLStack_20->bFunc,*(int **)(pPart_local + 3));
  nSizeNew = 0;
  do {
    iVar3 = nSizeNew;
    iVar4 = Vec_IntSize(pLStack_20->vVars);
    pLVar6 = pPart_local;
    if (iVar4 <= iVar3) {
      pLStack_20->nSize = local_5c;
      Vec_IntClear(pLStack_20->vVars);
      for (nSizeNew = 0; nSizeNew < *(int *)((long)&pPart_local[2].bFunc + 4);
          nSizeNew = nSizeNew + 1) {
        if ((*(int *)(*(long *)(pPart_local + 3) + (long)nSizeNew * 4) != 0) &&
           ((&(pPart_local[1].bFunc)->index)[nSizeNew] != 0)) {
          Vec_IntPush(pLStack_20->vVars,nSizeNew);
        }
      }
      for (nSizeNew = 0; iVar3 = nSizeNew, iVar4 = Vec_PtrSize((Vec_Ptr_t *)bCube), iVar3 < iVar4;
          nSizeNew = nSizeNew + 1) {
        vSingles = (Vec_Ptr_t *)Vec_PtrEntry((Vec_Ptr_t *)bCube,nSizeNew);
        Llb_NonlinQuantify1((Llb_Mgr_t *)pPart_local,(Llb_Prt_t *)vSingles,0);
      }
      Vec_PtrFree((Vec_Ptr_t *)bCube);
      return 0;
    }
    iVar3 = Vec_IntEntry(pLStack_20->vVars,nSizeNew);
    pTemp = (Llb_Prt_t *)Llb_MgrVar((Llb_Mgr_t *)pLVar6,iVar3);
    if (*(int *)(*(long *)(pPart_local + 3) + (long)pTemp->iPart * 4) == 0) {
      Length = Vec_IntRemove((Vec_Int_t *)pTemp->bFunc,pLStack_20->iPart);
      if (Length == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                      ,0x136,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
      }
      pTemp->nSize = pTemp->nSize - pLStack_20->nSize;
      iVar3 = Vec_IntSize((Vec_Int_t *)pTemp->bFunc);
      if (iVar3 == 0) {
        Llb_NonlinRemoveVar((Llb_Mgr_t *)pPart_local,(Llb_Var_t *)pTemp);
      }
      else {
        iVar3 = Vec_IntSize((Vec_Int_t *)pTemp->bFunc);
        pLVar6 = pPart_local;
        pDVar5 = bCube;
        if (iVar3 == 1) {
          iVar3 = Vec_IntEntry((Vec_Int_t *)pTemp->bFunc,0);
          pLVar6 = Llb_MgrPart((Llb_Mgr_t *)pLVar6,iVar3);
          Vec_PtrPushUnique((Vec_Ptr_t *)pDVar5,pLVar6);
        }
      }
    }
    else {
      iVar3 = Vec_IntSize((Vec_Int_t *)pTemp->bFunc);
      if (iVar3 < 2) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                      ,0x130,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
      }
      pTemp->nSize = pTemp->nSize - (pLStack_20->nSize - local_5c);
    }
    nSizeNew = nSizeNew + 1;
  } while( true );
}

Assistant:

int Llb_NonlinQuantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart, int fSubset )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    if ( fSubset )
    {        
        int Length;
//        int nSuppSize = Cudd_SupportSize( p->dd, pPart->bFunc );
//        pPart->bFunc = Cudd_SubsetHeavyBranch( p->dd, bTemp = pPart->bFunc, nSuppSize, 3*pPart->nSize/4 );  Cudd_Ref( pPart->bFunc );
        pPart->bFunc = Cudd_LargestCube( p->dd, bTemp = pPart->bFunc, &Length );  Cudd_Ref( pPart->bFunc );

        printf( "Subsetting %3d : ", pPart->iPart );
        printf( "(Supp =%3d  Node =%5d) -> ", Cudd_SupportSize(p->dd, bTemp),        Cudd_DagSize(bTemp) );
        printf( "(Supp =%3d  Node =%5d)\n",   Cudd_SupportSize(p->dd, pPart->bFunc), Cudd_DagSize(pPart->bFunc) );

        RetValue = (Cudd_DagSize(bTemp) == Cudd_DagSize(pPart->bFunc));

        Cudd_RecursiveDeref( p->dd, bTemp );

        if ( RetValue )
            return 1;
    }
    else
    {
        // create cube to be quantified
        bCube = Llb_NonlinCreateCube1( p, pPart );   Cudd_Ref( bCube );
//        assert( !Cudd_IsConstant(bCube) );
        // derive new function
        pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_NonlinRemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && p->pVars2Q[i] )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_NonlinQuantify1( p, pTemp, 0 );
    Vec_PtrFree( vSingles );
    return 0;
}